

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O3

REF_STATUS
ref_egads_face_curvature
          (REF_GEOM ref_geom,REF_INT geom,REF_DBL *kr,REF_DBL *r,REF_DBL *ks,REF_DBL *s)

{
  printf("curvature 0, 0: No EGADS linked for %s\n","ref_egads_face_curvature");
  *kr = 0.0;
  *r = 1.0;
  r[1] = 0.0;
  r[2] = 0.0;
  *ks = 0.0;
  *(undefined4 *)s = 0;
  *(undefined4 *)((long)s + 4) = 0;
  *(undefined4 *)(s + 1) = 0;
  *(undefined4 *)((long)s + 0xc) = 0x3ff00000;
  s[2] = 0.0;
  return 6;
}

Assistant:

REF_FCN REF_STATUS ref_egads_face_curvature(REF_GEOM ref_geom, REF_INT geom,
                                            REF_DBL *kr, REF_DBL *r,
                                            REF_DBL *ks, REF_DBL *s) {
#ifdef HAVE_EGADS
  REF_DBL uv[2];
  if (geom < 0 || ref_geom_max(ref_geom) <= geom) return REF_INVALID;
  REIS(REF_GEOM_FACE, ref_geom_type(ref_geom, geom), "expected face geom");

  uv[0] = ref_geom_param(ref_geom, 0, geom); /* ignores periodic */
  uv[1] = ref_geom_param(ref_geom, 1, geom);
  RAISE(ref_egads_face_curvature_at(ref_geom, ref_geom_id(ref_geom, geom),
                                    ref_geom_degen(ref_geom, geom), uv, kr, r,
                                    ks, s));
  return REF_SUCCESS;
#else
  printf("curvature 0, 0: No EGADS linked for %s\n", __func__);
  SUPRESS_UNUSED_COMPILER_WARNING(ref_geom);
  SUPRESS_UNUSED_COMPILER_WARNING(geom);
  *kr = 0.0;
  r[0] = 1.0;
  r[1] = 0.0;
  r[2] = 0.0;
  *ks = 0.0;
  s[0] = 0.0;
  s[1] = 1.0;
  s[2] = 0.0;
  return REF_IMPLEMENT;
#endif
}